

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.hpp
# Opt level: O2

void __thiscall
boost::unordered::detail::
table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
::create_buckets(table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
                 *this,size_t new_count)

{
  pointer ppVar1;
  array_constructor<std::allocator<boost::unordered::detail::ptr_bucket>_> constructor;
  array_constructor<std::allocator<boost::unordered::detail::ptr_bucket>_> local_38;
  ptr_bucket local_18;
  
  local_38.alloc_ = (allocator<boost::unordered::detail::ptr_bucket> *)&this->field_0x3;
  local_38.length_ = 0;
  local_18.next_ = (link_pointer)0x0;
  local_38.ptr_ = (bucket_pointer)0x0;
  local_38.constructed_ = (pointer)0x0;
  array_constructor<std::allocator<boost::unordered::detail::ptr_bucket>_>::
  construct<boost::unordered::detail::ptr_bucket>(&local_38,&local_18,new_count + 1);
  if (this->buckets_ != (bucket_pointer)0x0) {
    local_38.ptr_[new_count].next_ = this->buckets_[this->bucket_count_].next_;
    destroy_buckets(this);
  }
  ppVar1 = local_38.ptr_;
  this->bucket_count_ = new_count;
  local_38.ptr_ = (pointer)0x0;
  this->buckets_ = ppVar1;
  recalculate_max_load(this);
  array_constructor<std::allocator<boost::unordered::detail::ptr_bucket>_>::~array_constructor
            (&local_38);
  return;
}

Assistant:

void create_buckets(std::size_t new_count)
        {
            boost::unordered::detail::array_constructor<bucket_allocator>
                constructor(bucket_alloc());
    
            // Creates an extra bucket to act as the start node.
            constructor.construct(bucket(), new_count + 1);

            if (buckets_)
            {
                // Copy the nodes to the new buckets, including the dummy
                // node if there is one.
                (constructor.get() +
                    static_cast<std::ptrdiff_t>(new_count))->next_ =
                        (buckets_ + static_cast<std::ptrdiff_t>(
                            bucket_count_))->next_;
                destroy_buckets();
            }
            else if (bucket::extra_node)
            {
                node_constructor a(node_alloc());
                a.construct();

                (constructor.get() +
                    static_cast<std::ptrdiff_t>(new_count))->next_ =
                        a.release();
            }

            bucket_count_ = new_count;
            buckets_ = constructor.release();
            recalculate_max_load();
        }